

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

void __thiscall
testing::internal::ExpectationBase::ExpectationBase
          (ExpectationBase *this,char *a_file,int a_line,string *a_source_text)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_001982b8;
  this->file_ = a_file;
  this->line_ = a_line;
  (this->source_text_)._M_dataplus._M_p = (pointer)&(this->source_text_).field_2;
  pcVar2 = (a_source_text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source_text_,pcVar2,pcVar2 + a_source_text->_M_string_length);
  this->cardinality_specified_ = false;
  Between((testing *)&this->cardinality_,1,1);
  p_Var1 = &(this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
  (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  this->call_count_ = 0;
  this->retired_ = false;
  this->last_clause_ = kNone;
  this->action_count_checked_ = false;
  (this->untyped_actions_).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->untyped_actions_).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->untyped_actions_).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined8 *)
   ((long)&(this->untyped_actions_).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 0;
  Mutex::Mutex(&this->mutex_);
  return;
}

Assistant:

ExpectationBase::ExpectationBase(const char* a_file,
                                 int a_line,
                                 const string& a_source_text)
    : file_(a_file),
      line_(a_line),
      source_text_(a_source_text),
      cardinality_specified_(false),
      cardinality_(Exactly(1)),
      call_count_(0),
      retired_(false),
      extra_matcher_specified_(false),
      repeated_action_specified_(false),
      retires_on_saturation_(false),
      last_clause_(kNone),
      action_count_checked_(false) {}